

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

void __thiscall QHeaderViewPrivate::QHeaderViewPrivate(QHeaderViewPrivate *this)

{
  QAbstractItemViewPrivate *in_RDI;
  array<QMetaObject::Connection,_8UL> *unaff_retaddr;
  
  QAbstractItemViewPrivate::QAbstractItemViewPrivate(in_RDI);
  *(undefined ***)
   &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
       &PTR__QHeaderViewPrivate_00d2cc50;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate = 0;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x4 =
       0;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0xc =
       1;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x10 =
       0;
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x14 = 0
  ;
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x15 = 0
  ;
  QList<int>::QList((QList<int> *)0x842f41);
  QList<int>::QList((QList<int> *)0x842f52);
  QBitArray::QBitArray((QBitArray *)0x842f63);
  QHash<int,_int>::QHash
            ((QHash<int,_int> *)
             &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x60);
  QHash<int,_int>::QHash
            ((QHash<int,_int> *)
             &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x68);
  QSize::QSize((QSize *)in_RDI);
  QBasicTimer::QBasicTimer
            ((QBasicTimer *)
             &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              extra);
  *(undefined4 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           focus_next + 4) = 0xffffffff;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.focus_prev =
       0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           focus_prev + 4) = 0xffffffff;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.focus_child
       = 0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           focus_child + 4) = 0xffffffff;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.layout =
       0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           layout + 4) = 0xffffffff;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.needsFlush =
       0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           needsFlush + 4) = 0;
  *(undefined1 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.redirectDev
       = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           redirectDev + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           redirectDev + 2) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           redirectDev + 3) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           redirectDev + 4) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           redirectDev + 5) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           redirectDev + 6) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           redirectDev + 7) = 1;
  *(undefined1 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.widgetItem =
       0;
  *(undefined4 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           widgetItem + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
    extraPaintEngine = 0;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.polished =
       0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           polished + 4) = 0xffffffff;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
    graphicsEffect = 0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           graphicsEffect + 4) = 0;
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.imHints.
  super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.super_QFlagsStorage<Qt::InputMethodHint>.i =
       0xffffffff;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0xd4 =
       0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x8430a1);
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.dirty.d =
       (QRegionData *)0x0;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.toolTip.d.d
       = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
           toolTip.d.d + 4) = 1;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.toolTip.d.
    ptr = 1000;
  QList<QHeaderViewPrivate::SectionItem>::QList((QList<QHeaderViewPrivate::SectionItem> *)0x8430d8);
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.statusTip.d.
    ptr = 0;
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.statusTip.d.
  size = 0;
  QList<QHeaderViewPrivate::LayoutChangeItem>::QList
            ((QList<QHeaderViewPrivate::LayoutChangeItem> *)0x8430fe);
  std::array<QMetaObject::Connection,_8UL>::array(unaff_retaddr);
  return;
}

Assistant:

QHeaderViewPrivate()
        : state(NoState),
          headerOffset(0),
          sortIndicatorOrder(Qt::DescendingOrder),
          sortIndicatorSection(0),
          sortIndicatorShown(false),
          sortIndicatorClearable(false),
          lastPos(-1),
          firstPos(-1),
          originalSize(-1),
          section(-1),
          target(-1),
          firstPressed(-1),
          pressed(-1),
          hover(-1),
          length(0),
          preventCursorChangeInSetOffset(false),
          movableSections(false),
          clickableSections(false),
          highlightSelected(false),
          stretchLastSection(false),
          cascadingResizing(false),
          resizeRecursionBlock(false),
          allowUserMoveOfSection0(true), // will be false for QTreeView and true for QTableView
          customDefaultSectionSize(false),
          stretchSections(0),
          contentsSections(0),
          minimumSectionSize(-1),
          maximumSectionSize(-1),
          lastSectionSize(0),
          lastSectionLogicalIdx(-1), // Only trust when we stretch last section
          sectionIndicatorOffset(0),
#if QT_CONFIG(label)
          sectionIndicator(nullptr),
#endif
          globalResizeMode(QHeaderView::Interactive),
          sectionStartposRecalc(true),
          resizeContentsPrecision(1000)
    {}